

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::FindProgram
                   (string *__return_storage_ptr__,char *nameIn,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths,bool no_system_path)

{
  allocator local_41;
  string local_40;
  
  if ((nameIn == (char *)0x0) || (*nameIn == '\0')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_40);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,nameIn,&local_41);
    FindProgram(__return_storage_ptr__,&local_40,userPaths,no_system_path);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::FindProgram(
  const char* nameIn,
  const kwsys_stl::vector<kwsys_stl::string>& userPaths,
  bool no_system_path)
{
  if(!nameIn || !*nameIn)
    {
    return "";
    }
  return SystemTools::FindProgram(kwsys_stl::string(nameIn), userPaths, no_system_path);
}